

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

string * __thiscall
TOICompactRewardDecPOMDPDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,TOICompactRewardDecPOMDPDiscrete *this)

{
  ostream *poVar1;
  ulong uVar2;
  E *this_00;
  uint uVar3;
  string sStack_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  TOIDecPOMDPDiscrete::SoftPrint_abi_cxx11_(&sStack_1d8,&this->super_TOIDecPOMDPDiscrete);
  std::operator<<(local_1a8,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  if ((this->super_TOIDecPOMDPDiscrete).field_0x2b8 == '\x01') {
    poVar1 = std::operator<<(local_1a8,"Reward models: ");
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar3 = 0;
    while( true ) {
      uVar2 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                     super_TransitionObservationIndependentMADPDiscrete.
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      if (uVar2 == uVar3) break;
      poVar1 = std::operator<<(local_1a8,"Individual rewards for agent ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      (*((this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar3]->super_RewardModelDiscreteInterface).
        super_QTableInterface._vptr_QTableInterface[5])(&sStack_1d8);
      std::operator<<(local_1a8,(string *)&sStack_1d8);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      uVar3 = uVar3 + 1;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return __return_storage_ptr__;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"TOICompactRewardDecPOMDPDiscrete components (reward model) not initialized");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string TOICompactRewardDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << TOIDecPOMDPDiscrete::SoftPrint();

    if(_m_initialized)
    {
        ss << "Reward models: " << endl;
        for(unsigned int i=0;i!=GetNrAgents();++i)
        {
            ss << "Individual rewards for agent " << i << endl;
            ss << _m_p_rModels[i]->SoftPrint();
        }
    }
    else
        throw E("TOICompactRewardDecPOMDPDiscrete components (reward model) not initialized");

    return(ss.str());
}